

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O2

Break * __thiscall CFG::RelooperBuilder::makeBlockBreak(RelooperBuilder *this,int id)

{
  Break *pBVar1;
  Name name;
  
  name = getBlockBreakName(this,id);
  pBVar1 = ::wasm::Builder::makeBreak(&this->super_Builder,name,(Expression *)0x0,(Expression *)0x0)
  ;
  return pBVar1;
}

Assistant:

wasm::Break* makeBlockBreak(int id) {
    return wasm::Builder::makeBreak(getBlockBreakName(id));
  }